

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O1

void * Intp_ManUnsatCore(Intp_Man_t *p,Sto_Man_t *pCnf,int fLearned,int fVerbose)

{
  size_t __n;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  Sto_Man_t *pSVar5;
  int iVar6;
  FILE *pFVar7;
  undefined8 *puVar8;
  void **ppvVar9;
  Vec_Int_t *vCore;
  int *piVar10;
  Vec_Str_t *vVisited;
  char *__s;
  long lVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  Sto_Cls_t *pSVar15;
  ulong uVar16;
  timespec ts;
  timespec local_48;
  double local_38;
  
  iVar6 = clock_gettime(3,&local_48);
  if (iVar6 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3cc,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  p->pCnf = pCnf;
  p->fVerbose = fVerbose;
  Intp_ManResize(p);
  if (p->fProofWrite != 0) {
    pFVar7 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar7;
    p->Counter = 0;
  }
  p->vAntClas->nSize = 0;
  p->nAntStart = p->pCnf->nRoots;
  for (pSVar15 = p->pCnf->pHead; (pSVar15 != (Sto_Cls_t *)0x0 && ((pSVar15->field_0x1c & 2) != 0));
      pSVar15 = pSVar15->pNext) {
    Intp_ManProofWriteOne(p,pSVar15);
  }
  iVar6 = Intp_ManProcessRoots(p);
  if (iVar6 != 0) {
    for (pSVar15 = p->pCnf->pHead; pSVar15 != (Sto_Cls_t *)0x0; pSVar15 = pSVar15->pNext) {
      if ((pSVar15->field_0x1c & 2) == 0) {
        iVar6 = Intp_ManProofRecordOne(p,pSVar15);
        if (iVar6 == 0) break;
      }
    }
  }
  pVVar4 = p->vAntClas;
  uVar1 = pVVar4->nSize;
  if (p->pCnf->pEmpty->Id - p->nAntStart != uVar1 - 1) {
    __assert_fail("p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterP.c"
                  ,0x3f7,"void *Intp_ManUnsatCore(Intp_Man_t *, Sto_Man_t *, int, int)");
  }
  puVar8 = (undefined8 *)malloc(0x10);
  *puVar8 = 0;
  puVar8[1] = 0;
  uVar2 = pVVar4->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc(0x80);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar9;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_008d6cdd;
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar9 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar9 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
      }
      pVVar4->pArray = ppvVar9;
    }
    pVVar4->nCap = iVar6;
  }
LAB_008d6cdd:
  iVar6 = pVVar4->nSize;
  pVVar4->nSize = iVar6 + 1;
  pVVar4->pArray[iVar6] = puVar8;
  if (p->fProofWrite != 0) {
    fclose((FILE *)p->pFile);
    p->pFile = (FILE *)0x0;
  }
  if (fVerbose != 0) {
    pSVar5 = p->pCnf;
    uVar1 = pSVar5->nVars;
    uVar2 = pSVar5->nRoots;
    uVar3 = p->Counter;
    uVar13 = pSVar5->nClauses - uVar2;
    local_38 = (double)(int)(uVar3 - uVar2) / (double)(int)uVar13;
    iVar6 = Sto_ManMemoryReport(pSVar5);
    printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n",
           SUB84(local_38,0),(double)iVar6 * 9.5367431640625e-07,(ulong)uVar1,(ulong)uVar2,
           (ulong)uVar13,(ulong)uVar3);
    iVar6 = clock_gettime(3,&local_48);
    if (iVar6 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    p->timeTotal = p->timeTotal + lVar12 + lVar11;
  }
  vCore = (Vec_Int_t *)malloc(0x10);
  vCore->nCap = 1000;
  vCore->nSize = 0;
  piVar10 = (int *)malloc(4000);
  vCore->pArray = piVar10;
  pSVar5 = p->pCnf;
  uVar16 = (ulong)pSVar5->pEmpty->Id;
  __n = uVar16 + 1;
  vVisited = (Vec_Str_t *)malloc(0x10);
  iVar14 = (int)__n;
  iVar6 = 0x10;
  if (0xe < uVar16) {
    iVar6 = iVar14;
  }
  vVisited->nSize = 0;
  vVisited->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (char *)0x0;
  }
  else {
    __s = (char *)malloc((long)iVar6);
  }
  vVisited->pArray = __s;
  vVisited->nSize = iVar14;
  memset(__s,0,__n);
  Intp_ManUnsatCore_rec(p->vAntClas,pSVar5->pEmpty->Id,vCore,pSVar5->nRoots,vVisited,fLearned);
  if (__s != (char *)0x0) {
    free(__s);
    vVisited->pArray = (char *)0x0;
  }
  free(vVisited);
  if (fVerbose != 0) {
    uVar1 = p->pCnf->nRoots;
    printf("Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n",(ulong)uVar1,
           (ulong)(p->pCnf->nClauses - uVar1),(ulong)(uint)vCore->nSize);
  }
  return vCore;
}

Assistant:

void * Intp_ManUnsatCore( Intp_Man_t * p, Sto_Man_t * pCnf, int fLearned, int fVerbose )
{
    Vec_Int_t * vCore;
    Vec_Str_t * vVisited;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;

    // adjust the manager
    Intp_ManResize( p ); 

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
//    Vec_IntClear( p->vAnties );
//    Vec_IntFill( p->vBreaks, p->pCnf->nRoots, 0 );
    Vec_PtrClear( p->vAntClas );
    p->nAntStart = p->pCnf->nRoots;

    Sto_ManForEachClauseRoot( p->pCnf, pClause )
        Intp_ManProofWriteOne( p, pClause );

    // propagate root level assignments
    if ( Intp_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Intp_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
        }
    }

    // add the last breaker
//    assert( p->pCnf->pEmpty->Id == Vec_IntSize(p->vBreaks) - 1 );
//    Vec_IntPush( p->vBreaks, Vec_IntSize(p->vAnties) );
    assert( p->pCnf->pEmpty->Id - p->nAntStart == Vec_PtrSize(p->vAntClas) - 1 );
    Vec_PtrPush( p->vAntClas, Vec_IntAlloc(0) );

    // stop the proof
    if ( p->fProofWrite )
    {
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Core", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB\n", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    // derive the UNSAT core
    vCore = Vec_IntAlloc( 1000 );
    vVisited = Vec_StrStart( p->pCnf->pEmpty->Id+1 );
    Intp_ManUnsatCore_rec( p->vAntClas, p->pCnf->pEmpty->Id, vCore, p->pCnf->nRoots, vVisited, fLearned );
    Vec_StrFree( vVisited );
    if ( fVerbose )
        printf( "Root clauses = %d. Learned clauses = %d. UNSAT core size = %d.\n", 
            p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, Vec_IntSize(vCore) );
//    Intp_ManUnsatCoreVerify( p->pCnf, vCore );
    return vCore;   
}